

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall
QDateTimeEditPrivate::emitSignals(QDateTimeEditPrivate *this,EmitPolicy ep,QVariant *old)

{
  QDate _t1;
  bool bVar1;
  uint uVar2;
  Int IVar3;
  int in_ESI;
  QDateTimeEditPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  bool timechanged;
  bool dotime;
  bool datechanged;
  bool dodate;
  QDateTimeEdit *q;
  undefined4 in_stack_ffffffffffffff38;
  QTime in_stack_ffffffffffffff3c;
  QDateTimeEdit *in_stack_ffffffffffffff40;
  QVariant *in_stack_ffffffffffffff48;
  QDateTimeEditPrivate *in_stack_ffffffffffffff50;
  bool local_9c;
  bool local_9a;
  QDateTime local_58 [8];
  undefined1 local_50 [24];
  undefined4 local_38;
  undefined4 local_34;
  QFlagsStorageHelper<QDateTimeEdit::Section,_4> local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_20;
  QFlagsStorageHelper<QDateTimeEdit::Section,_4> local_14;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_ESI != 2) {
    *(ushort *)&(in_RDI->super_QAbstractSpinBoxPrivate).field_0x3d0 =
         *(ushort *)&(in_RDI->super_QAbstractSpinBoxPrivate).field_0x3d0 & 0xfffe;
    local_10 = ::QVariant::toDate();
    bVar1 = QDate::isValid((QDate *)in_stack_ffffffffffffff50);
    bVar4 = false;
    if (bVar1) {
      local_14.super_QFlagsStorage<QDateTimeEdit::Section>.i =
           (QFlagsStorage<QDateTimeEdit::Section>)
           QFlags<QDateTimeEdit::Section>::operator&
                     ((QFlags<QDateTimeEdit::Section> *)in_stack_ffffffffffffff40,
                      in_stack_ffffffffffffff3c.mds);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
      bVar4 = IVar3 != 0;
    }
    local_9a = true;
    if (in_ESI != 1) {
      local_20 = ::QVariant::toDate();
      local_28 = ::QVariant::toDate();
      local_9a = ::operator!=((QDate *)in_stack_ffffffffffffff40,
                              (QDate *)CONCAT44(in_stack_ffffffffffffff3c.mds,
                                                in_stack_ffffffffffffff38));
    }
    local_2c = ::QVariant::toTime();
    uVar2 = QTime::isValid();
    bVar1 = false;
    if ((uVar2 & 1) != 0) {
      local_30.super_QFlagsStorage<QDateTimeEdit::Section>.i =
           (QFlagsStorage<QDateTimeEdit::Section>)
           QFlags<QDateTimeEdit::Section>::operator&
                     ((QFlags<QDateTimeEdit::Section> *)in_stack_ffffffffffffff40,
                      in_stack_ffffffffffffff3c.mds);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
      bVar1 = IVar3 != 0;
    }
    local_9c = true;
    if (in_ESI != 1) {
      local_34 = ::QVariant::toTime();
      local_38 = ::QVariant::toTime();
      local_9c = ::operator!=((QTime *)in_stack_ffffffffffffff40,
                              (QTime *)CONCAT44(in_stack_ffffffffffffff3c.mds,
                                                in_stack_ffffffffffffff38));
    }
    (**(code **)(*(long *)&(in_RDI->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
              (local_50);
    updateCache(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                (QString *)in_stack_ffffffffffffff40);
    QString::~QString((QString *)0x561148);
    syncCalendarWidget(in_RDI);
    if ((local_9a != false) || (local_9c != false)) {
      ::QVariant::toDateTime();
      QDateTimeEdit::dateTimeChanged
                (in_stack_ffffffffffffff40,
                 (QDateTime *)CONCAT44(in_stack_ffffffffffffff3c.mds,in_stack_ffffffffffffff38));
      QDateTime::~QDateTime(local_58);
    }
    if ((bVar4) && (local_9a != false)) {
      ::QVariant::toDate();
      _t1.jd._4_4_ = in_stack_ffffffffffffff3c.mds;
      _t1.jd._0_4_ = in_stack_ffffffffffffff38;
      QDateTimeEdit::dateChanged((QDateTimeEdit *)0x5611d6,_t1);
    }
    if ((bVar1) && (local_9c != false)) {
      ::QVariant::toTime();
      QDateTimeEdit::timeChanged((QDateTimeEdit *)0x561211,in_stack_ffffffffffffff3c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEditPrivate::emitSignals(EmitPolicy ep, const QVariant &old)
{
    Q_Q(QDateTimeEdit);
    if (ep == NeverEmit) {
        return;
    }
    pendingEmit = false;

    const bool dodate = value.toDate().isValid() && (sections & DateSectionMask);
    const bool datechanged = (ep == AlwaysEmit || old.toDate() != value.toDate());
    const bool dotime = value.toTime().isValid() && (sections & TimeSectionMask);
    const bool timechanged = (ep == AlwaysEmit || old.toTime() != value.toTime());

    updateCache(value, displayText());

    syncCalendarWidget();
    if (datechanged || timechanged)
        emit q->dateTimeChanged(value.toDateTime());
    if (dodate && datechanged)
        emit q->dateChanged(value.toDate());
    if (dotime && timechanged)
        emit q->timeChanged(value.toTime());

}